

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_init_tile_thread_data(AV1_PRIMARY *ppi,int is_first_pass)

{
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  SequenceHeader *seq_params;
  tran_low_t *ptVar5;
  PICK_MODE_CONTEXT *pPVar6;
  void *pvVar7;
  int in_ESI;
  long in_RDI;
  int j_1;
  int num_64x64_blocks;
  int mi_count_in_sb;
  BLOCK_SIZE sb_size;
  int plane_types;
  int j;
  int y;
  int x;
  ThreadData_conflict *td;
  EncWorkerData *thread_data;
  int i;
  int num_enc_workers;
  int num_workers;
  PrimaryMultiThreadInfo *p_mt_info;
  PC_TREE_SHARED_BUFFERS *in_stack_00000178;
  BLOCK_SIZE in_stack_00000187;
  AV1_COMP *in_stack_00000188;
  int in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  PC_TREE_SHARED_BUFFERS *in_stack_ffffffffffffffc8;
  int local_24;
  
  local_24 = ((PrimaryMultiThreadInfo *)(in_RDI + 0x123d0))->num_workers;
  iVar3 = av1_get_num_mod_workers_for_alloc((PrimaryMultiThreadInfo *)(in_RDI + 0x123d0),MOD_ENC);
  while (local_24 = local_24 + -1, -1 < local_24) {
    seq_params = (SequenceHeader *)(*(long *)(in_RDI + 0x12410) + (long)local_24 * 0x1d0);
    if (0 < local_24) {
      in_stack_ffffffffffffffc8 =
           (PC_TREE_SHARED_BUFFERS *)
           aom_memalign((size_t)in_stack_ffffffffffffffc8,
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      if (in_stack_ffffffffffffffc8 == (PC_TREE_SHARED_BUFFERS *)0x0) {
        aom_internal_error((aom_internal_error_info *)(in_RDI + 0xc760),AOM_CODEC_MEM_ERROR,
                           "Failed to allocate td");
      }
      memset(in_stack_ffffffffffffffc8,0,0x26e60);
      *(PC_TREE_SHARED_BUFFERS **)&seq_params->max_frame_width = in_stack_ffffffffffffffc8;
      *(PC_TREE_SHARED_BUFFERS **)&seq_params->frame_id_numbers_present_flag =
           in_stack_ffffffffffffffc8;
      av1_setup_shared_coeff_buffer
                (seq_params,in_stack_ffffffffffffffc8,
                 (aom_internal_error_info *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      ptVar5 = (tran_low_t *)
               aom_memalign((size_t)in_stack_ffffffffffffffc8,
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      in_stack_ffffffffffffffc8[0x867].dqcoeff_buf[0] = ptVar5;
      if (in_stack_ffffffffffffffc8[0x867].dqcoeff_buf[0] == (tran_low_t *)0x0) {
        aom_internal_error((aom_internal_error_info *)(in_RDI + 0xc760),AOM_CODEC_MEM_ERROR,
                           "Failed to allocate td->tmp_conv_dst");
      }
      if (local_24 < *(int *)(in_RDI + 0x123d4)) {
        pPVar6 = av1_alloc_pmc(in_stack_00000188,in_stack_00000187,in_stack_00000178);
        in_stack_ffffffffffffffc8[0x869].coeff_buf[0] = (tran_low_t *)pPVar6;
        if (in_stack_ffffffffffffffc8[0x869].coeff_buf[0] == (tran_low_t *)0x0) {
          aom_internal_error((aom_internal_error_info *)(in_RDI + 0xc760),AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
        }
      }
      if ((in_ESI == 0) && (local_24 < iVar3)) {
        iVar4 = av1_setup_sms_tree(_mi_count_in_sb,_j_1);
        if (iVar4 != 0) {
          aom_internal_error((aom_internal_error_info *)(in_RDI + 0xc760),AOM_CODEC_MEM_ERROR,
                             "Failed to allocate SMS tree");
        }
        for (in_stack_ffffffffffffffc4 = 0; in_stack_ffffffffffffffc4 < 2;
            in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1) {
          for (in_stack_ffffffffffffffc0 = 0; in_stack_ffffffffffffffc0 < 2;
              in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + 1) {
            ptVar5 = (tran_low_t *)aom_malloc(0x23cc6b);
            in_stack_ffffffffffffffc8[0x866].coeff_buf
            [(long)in_stack_ffffffffffffffc4 * 2 + (long)in_stack_ffffffffffffffc0 + 1] = ptVar5;
            if (in_stack_ffffffffffffffc8[0x866].coeff_buf
                [(long)in_stack_ffffffffffffffc4 * 2 + (long)in_stack_ffffffffffffffc0 + 1] ==
                (tran_low_t *)0x0) {
              aom_internal_error((aom_internal_error_info *)(in_RDI + 0xc760),AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate td->hash_value_buffer[x][y]");
            }
          }
        }
        ptVar5 = (tran_low_t *)
                 aom_calloc(CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        in_stack_ffffffffffffffc8[0x864].dqcoeff_buf[1] = ptVar5;
        if (in_stack_ffffffffffffffc8[0x864].dqcoeff_buf[1] == (tran_low_t *)0x0) {
          aom_internal_error((aom_internal_error_info *)(in_RDI + 0xc760),AOM_CODEC_MEM_ERROR,
                             "Failed to allocate td->counts");
        }
        ptVar5 = (tran_low_t *)
                 aom_memalign((size_t)in_stack_ffffffffffffffc8,
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        in_stack_ffffffffffffffc8[0x867].coeff_buf[0] = ptVar5;
        if (in_stack_ffffffffffffffc8[0x867].coeff_buf[0] == (tran_low_t *)0x0) {
          aom_internal_error((aom_internal_error_info *)(in_RDI + 0xc760),AOM_CODEC_MEM_ERROR,
                             "Failed to allocate td->palette_buffer");
        }
        if (*(int *)(*(long *)(in_RDI + 0x160) + 0x42370) != 0) {
          alloc_obmc_buffers((OBMCBuffer *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             (aom_internal_error_info *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          alloc_compound_type_rd_buffers
                    ((aom_internal_error_info *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (CompoundTypeRdBuffers *)
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          for (in_stack_ffffffffffffffbc = 0; in_stack_ffffffffffffffbc < 2;
              in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 1) {
            ptVar5 = (tran_low_t *)
                     aom_memalign((size_t)in_stack_ffffffffffffffc8,
                                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
            in_stack_ffffffffffffffc8[0x867].dqcoeff_buf[(long)in_stack_ffffffffffffffbc + 2] =
                 ptVar5;
            if (in_stack_ffffffffffffffc8[0x867].dqcoeff_buf[(long)in_stack_ffffffffffffffbc + 2] ==
                (tran_low_t *)0x0) {
              aom_internal_error((aom_internal_error_info *)(in_RDI + 0xc760),AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate td->tmp_pred_bufs[j]");
            }
          }
        }
        _Var2 = is_gradient_caching_for_hog_enabled
                          ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                          );
        if (_Var2) {
          in_stack_ffffffffffffffb8 = 2 >> (*(byte *)(in_RDI + 0xc005) & 0x1f);
          ptVar5 = (tran_low_t *)aom_malloc(0x23cea5);
          in_stack_ffffffffffffffc8[0x8a4].qcoeff_buf[1] = ptVar5;
          if (in_stack_ffffffffffffffc8[0x8a4].qcoeff_buf[1] == (tran_low_t *)0x0) {
            aom_internal_error((aom_internal_error_info *)(in_RDI + 0xc760),AOM_CODEC_MEM_ERROR,
                               "Failed to allocate td->pixel_gradient_info");
          }
        }
        _Var2 = is_src_var_for_4x4_sub_blocks_caching_enabled(*(AV1_COMP **)(in_RDI + 0x160));
        if (_Var2) {
          bVar1 = *(byte *)(*(long *)(*(long *)(in_RDI + 0x160) + 0x42008) + 0x1c);
          in_stack_ffffffffffffffb4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffb4);
          in_stack_ffffffffffffffb0 =
               (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [bVar1] *
               (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [bVar1];
          ptVar5 = (tran_low_t *)aom_malloc(0x23cf53);
          in_stack_ffffffffffffffc8[0x8a4].qcoeff_buf[2] = ptVar5;
          if (in_stack_ffffffffffffffc8[0x8a4].qcoeff_buf[2] == (tran_low_t *)0x0) {
            aom_internal_error((aom_internal_error_info *)(in_RDI + 0xc760),AOM_CODEC_MEM_ERROR,
                               "Failed to allocate td->src_var_info_of_4x4_sub_blocks");
          }
        }
        if (*(char *)(*(long *)(in_RDI + 0x160) + 0x60950) == '\x02') {
          in_stack_ffffffffffffffac = 4;
          if (*(char *)(in_RDI + 0xbfd4) == '\f') {
            in_stack_ffffffffffffffac = 1;
          }
          ptVar5 = (tran_low_t *)aom_malloc(0x23cfdd);
          in_stack_ffffffffffffffc8[0x868].dqcoeff_buf[1] = ptVar5;
          if (in_stack_ffffffffffffffc8[0x868].dqcoeff_buf[1] == (tran_low_t *)0x0) {
            aom_internal_error((aom_internal_error_info *)(in_RDI + 0xc760),AOM_CODEC_MEM_ERROR,
                               "Failed to allocate td->vt64x64");
          }
        }
      }
    }
    if (((in_ESI == 0) && ((*(byte *)(*(long *)(in_RDI + 0x160) + 0x42771) & 1) == 1)) &&
       (local_24 < iVar3)) {
      if (local_24 == 0) {
        for (in_stack_ffffffffffffffa8 = 0; in_stack_ffffffffffffffa8 < *(int *)(in_RDI + 0x148);
            in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 + 1) {
          pvVar7 = aom_memalign((size_t)in_stack_ffffffffffffffc8,
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
          *(void **)(*(long *)(in_RDI + (long)in_stack_ffffffffffffffa8 * 8) + 0x3ada0) = pvVar7;
          if (*(long *)(*(long *)(in_RDI + (long)in_stack_ffffffffffffffa8 * 8) + 0x3ada0) == 0) {
            aom_internal_error((aom_internal_error_info *)(in_RDI + 0xc760),AOM_CODEC_MEM_ERROR,
                               "Failed to allocate ppi->parallel_cpi[j]->td.tctx");
          }
        }
      }
      else {
        pvVar7 = aom_memalign((size_t)in_stack_ffffffffffffffc8,
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        *(void **)(*(long *)&seq_params->max_frame_width + 0x25d70) = pvVar7;
        if (*(long *)(*(long *)&seq_params->max_frame_width + 0x25d70) == 0) {
          aom_internal_error((aom_internal_error_info *)(in_RDI + 0xc760),AOM_CODEC_MEM_ERROR,
                             "Failed to allocate thread_data->td->tctx");
        }
      }
    }
  }
  *(int *)(in_RDI + 0x12444) = iVar3;
  return;
}

Assistant:

void av1_init_tile_thread_data(AV1_PRIMARY *ppi, int is_first_pass) {
  PrimaryMultiThreadInfo *const p_mt_info = &ppi->p_mt_info;

  assert(p_mt_info->workers != NULL);
  assert(p_mt_info->tile_thr_data != NULL);

  int num_workers = p_mt_info->num_workers;
  int num_enc_workers = av1_get_num_mod_workers_for_alloc(p_mt_info, MOD_ENC);
  assert(num_enc_workers <= num_workers);
  for (int i = num_workers - 1; i >= 0; i--) {
    EncWorkerData *const thread_data = &p_mt_info->tile_thr_data[i];

    if (i > 0) {
      // Allocate thread data.
      ThreadData *td;
      AOM_CHECK_MEM_ERROR(&ppi->error, td, aom_memalign(32, sizeof(*td)));
      av1_zero(*td);
      thread_data->original_td = thread_data->td = td;

      // Set up shared coeff buffers.
      av1_setup_shared_coeff_buffer(&ppi->seq_params, &td->shared_coeff_buf,
                                    &ppi->error);
      AOM_CHECK_MEM_ERROR(&ppi->error, td->tmp_conv_dst,
                          aom_memalign(32, MAX_SB_SIZE * MAX_SB_SIZE *
                                               sizeof(*td->tmp_conv_dst)));

      if (i < p_mt_info->num_mod_workers[MOD_FP]) {
        // Set up firstpass PICK_MODE_CONTEXT.
        td->firstpass_ctx =
            av1_alloc_pmc(ppi->cpi, BLOCK_16X16, &td->shared_coeff_buf);
        if (!td->firstpass_ctx)
          aom_internal_error(&ppi->error, AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
      }

      if (!is_first_pass && i < num_enc_workers) {
        // Set up sms_tree.
        if (av1_setup_sms_tree(ppi->cpi, td)) {
          aom_internal_error(&ppi->error, AOM_CODEC_MEM_ERROR,
                             "Failed to allocate SMS tree");
        }

        for (int x = 0; x < 2; x++)
          for (int y = 0; y < 2; y++)
            AOM_CHECK_MEM_ERROR(
                &ppi->error, td->hash_value_buffer[x][y],
                (uint32_t *)aom_malloc(AOM_BUFFER_SIZE_FOR_BLOCK_HASH *
                                       sizeof(*td->hash_value_buffer[0][0])));

        // Allocate frame counters in thread data.
        AOM_CHECK_MEM_ERROR(&ppi->error, td->counts,
                            aom_calloc(1, sizeof(*td->counts)));

        // Allocate buffers used by palette coding mode.
        AOM_CHECK_MEM_ERROR(&ppi->error, td->palette_buffer,
                            aom_memalign(16, sizeof(*td->palette_buffer)));

        // The buffers 'tmp_pred_bufs[]', 'comp_rd_buffer' and 'obmc_buffer' are
        // used in inter frames to store intermediate inter mode prediction
        // results and are not required for allintra encoding mode. Hence, the
        // memory allocations for these buffers are avoided for allintra
        // encoding mode.
        if (ppi->cpi->oxcf.kf_cfg.key_freq_max != 0) {
          alloc_obmc_buffers(&td->obmc_buffer, &ppi->error);

          alloc_compound_type_rd_buffers(&ppi->error, &td->comp_rd_buffer);

          for (int j = 0; j < 2; ++j) {
            AOM_CHECK_MEM_ERROR(
                &ppi->error, td->tmp_pred_bufs[j],
                aom_memalign(32, 2 * MAX_MB_PLANE * MAX_SB_SQUARE *
                                     sizeof(*td->tmp_pred_bufs[j])));
          }
        }

        if (is_gradient_caching_for_hog_enabled(ppi->cpi)) {
          const int plane_types = PLANE_TYPES >> ppi->seq_params.monochrome;
          AOM_CHECK_MEM_ERROR(&ppi->error, td->pixel_gradient_info,
                              aom_malloc(sizeof(*td->pixel_gradient_info) *
                                         plane_types * MAX_SB_SQUARE));
        }

        if (is_src_var_for_4x4_sub_blocks_caching_enabled(ppi->cpi)) {
          const BLOCK_SIZE sb_size = ppi->cpi->common.seq_params->sb_size;
          const int mi_count_in_sb =
              mi_size_wide[sb_size] * mi_size_high[sb_size];

          AOM_CHECK_MEM_ERROR(
              &ppi->error, td->src_var_info_of_4x4_sub_blocks,
              aom_malloc(sizeof(*td->src_var_info_of_4x4_sub_blocks) *
                         mi_count_in_sb));
        }

        if (ppi->cpi->sf.part_sf.partition_search_type == VAR_BASED_PARTITION) {
          const int num_64x64_blocks =
              (ppi->seq_params.sb_size == BLOCK_64X64) ? 1 : 4;
          AOM_CHECK_MEM_ERROR(
              &ppi->error, td->vt64x64,
              aom_malloc(sizeof(*td->vt64x64) * num_64x64_blocks));
        }
      }
    }

    if (!is_first_pass && ppi->cpi->oxcf.row_mt == 1 && i < num_enc_workers) {
      if (i == 0) {
        for (int j = 0; j < ppi->num_fp_contexts; j++) {
          AOM_CHECK_MEM_ERROR(&ppi->error, ppi->parallel_cpi[j]->td.tctx,
                              (FRAME_CONTEXT *)aom_memalign(
                                  16, sizeof(*ppi->parallel_cpi[j]->td.tctx)));
        }
      } else {
        AOM_CHECK_MEM_ERROR(
            &ppi->error, thread_data->td->tctx,
            (FRAME_CONTEXT *)aom_memalign(16, sizeof(*thread_data->td->tctx)));
      }
    }
  }

  // Record the number of workers in encode stage multi-threading for which
  // allocation is done.
  p_mt_info->prev_num_enc_workers = num_enc_workers;
}